

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c++
# Opt level: O2

void __thiscall kj::_::BTreeImpl::Parent::eraseAfter(Parent *this,uint i)

{
  memmove(this->keys + i,this->keys + (ulong)i + 1,(ulong)(i + 1) * -4 + 0x1c);
  this->keys[6].i = 0;
  memmove(this->children + (ulong)i + 1,this->children + (ulong)i + 2,(ulong)(i + 2) * -4 + 0x20);
  this->children[7] = 0;
  return;
}

Assistant:

void BTreeImpl::Parent::eraseAfter(uint i) {
  amove(keys + i, keys + i + 1, Parent::NKEYS - (i + 1));
  keys[Parent::NKEYS - 1] = nullptr;
  amove(children + i + 1, children + i + 2, Parent::NCHILDREN - (i + 2));
  children[Parent::NCHILDREN - 1] = 0;
}